

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
str_writer<char>::operator()
          (str_writer<char> *this,ostream_iterator<char,_char,_std::char_traits<char>_> *it)

{
  ulong uVar1;
  char *__value;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_30;
  
  __value = *(char **)this;
  local_30._M_stream = it->_M_stream;
  local_30._M_string = it->_M_string;
  if (0 < *(long *)(this + 8)) {
    uVar1 = *(long *)(this + 8) + 1;
    do {
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_30,__value);
      __value = __value + 1;
      uVar1 = uVar1 - 1;
    } while (1 < uVar1);
  }
  it->_M_stream = local_30._M_stream;
  it->_M_string = local_30._M_string;
  return;
}

Assistant:

void operator()(It &&it) const {
      it = internal::copy_str<char_type>(s, s + size_, it);
    }